

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_print.h
# Opt level: O2

void Color::print_row<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *column,vector<int,_std::allocator<int>_> *width)

{
  pointer pbVar1;
  ostream *poVar2;
  pointer pbVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  allocator local_6e;
  allocator local_6d;
  Logger local_6c;
  string local_68;
  string local_48;
  
  pbVar1 = (column->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = (column->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)pbVar1 - (long)pbVar3 >> 5 ==
      (long)(width->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(width->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start >> 2) {
    lVar4 = 0;
    for (uVar5 = 0; uVar5 < (ulong)((long)pbVar1 - (long)pbVar3 >> 5); uVar5 = uVar5 + 1) {
      *(long *)(operator_delete__ + *(long *)(std::cout + -0x18)) =
           (long)(width->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar5];
      std::operator<<((ostream *)&std::cout,(string *)((long)&(pbVar3->_M_dataplus)._M_p + lVar4));
      pbVar3 = (column->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (column->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar4 = lVar4 + 0x20;
    }
    std::operator<<((ostream *)&std::cout,"\n");
    return;
  }
  local_6c.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/format_print.h"
             ,&local_6d);
  std::__cxx11::string::string((string *)&local_68,"print_row",&local_6e);
  poVar2 = Logger::Start(ERR,&local_48,0xd4,&local_68);
  poVar2 = std::operator<<(poVar2,"CHECK_EQ failed ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/format_print.h"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xd4);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"column.size()");
  poVar2 = std::operator<<(poVar2," = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"width.size()");
  poVar2 = std::operator<<(poVar2," = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  Logger::~Logger(&local_6c);
  abort();
}

Assistant:

void print_row(const std::vector<T> &column, const std::vector<int> &width) {
  CHECK_EQ(column.size(), width.size());
  for (size_t i = 0; i < column.size(); ++i) {
    std::cout.width(width[i]);
    std::cout << column[i];
  }
  std::cout << "\n";
}